

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

_Bool sysbvm_string_equalsCString(sysbvm_tuple_t string,char *cstring)

{
  _Bool _Var1;
  int iVar2;
  size_t __n;
  size_t sVar3;
  uint8_t *firstBytes;
  size_t secondSize;
  size_t firstSize;
  char *cstring_local;
  sysbvm_tuple_t string_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(string);
  if (_Var1) {
    __n = sysbvm_tuple_getSizeInBytes(string);
    sVar3 = strlen(cstring);
    if (__n == sVar3) {
      iVar2 = memcmp((void *)(string + 0x10),cstring,__n);
      string_local._7_1_ = iVar2 == 0;
    }
    else {
      string_local._7_1_ = false;
    }
  }
  else {
    string_local._7_1_ = false;
  }
  return string_local._7_1_;
}

Assistant:

SYSBVM_API bool sysbvm_string_equalsCString(sysbvm_tuple_t string, const char *cstring)
{
    if(!sysbvm_tuple_isNonNullPointer(string))
        return false;

    size_t firstSize = sysbvm_tuple_getSizeInBytes(string);
    size_t secondSize = strlen(cstring);
    if(firstSize != secondSize)
        return false;

    uint8_t *firstBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(string)->bytes;
    return memcmp(firstBytes, cstring, firstSize) == 0;
}